

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int LoadEXRMultipartImageFromMemory
              (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,uchar *memory,size_t size
              ,char **err)

{
  OffsetData *offset_data;
  EXRHeader *exr_header;
  long *plVar1;
  _Alloc_hider _Var2;
  int iVar3;
  ulong uVar4;
  pointer pvVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong __n;
  char *pcVar11;
  pointer pvVar12;
  ulong uVar13;
  pointer pvVar14;
  ulong uVar15;
  long lVar16;
  pointer puVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  ulong *puVar21;
  bool bVar22;
  string e;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> chunk_offset_table_list;
  vector<int,_std::allocator<int>_> num_x_tiles;
  vector<int,_std::allocator<int>_> num_y_tiles;
  int local_e4;
  string local_d0;
  pointer local_b0;
  uchar *local_a8;
  int local_a0;
  int local_9c;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> local_98;
  pointer local_80;
  vector<int,_std::allocator<int>_> local_78;
  EXRImage *local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_a8 = memory;
  if (size < 9 ||
      ((memory == (uchar *)0x0 || num_parts == 0) ||
      (exr_headers == (EXRHeader **)0x0 || exr_images == (EXRImage *)0x0))) {
    pcVar11 = "Invalid argument for LoadEXRMultipartImageFromMemory()";
    pcVar7 = "";
LAB_001caadc:
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,pcVar11,pcVar7);
    _Var2._M_p = local_d0._M_dataplus._M_p;
    if (err != (char **)0x0) {
      pcVar7 = strdup(local_d0._M_dataplus._M_p);
      *err = pcVar7;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var2._M_p != &local_d0.field_2) {
      operator_delete(_Var2._M_p);
    }
    iVar19 = -3;
  }
  else {
    __n = (ulong)num_parts;
    uVar4 = 0;
    lVar9 = 0;
    do {
      if ((ulong)exr_headers[uVar4]->header_len == 0) {
        pcVar11 = "EXRHeader variable is not initialized.";
        pcVar7 = "";
        goto LAB_001caadc;
      }
      lVar9 = lVar9 + (ulong)exr_headers[uVar4]->header_len;
      uVar4 = uVar4 + 1;
    } while (__n != uVar4);
    local_98.super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58 = exr_images;
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::reserve(&local_98,__n);
    puVar21 = (ulong *)(local_a8 + lVar9 + 9);
    local_e4 = -3;
    bVar22 = true;
    uVar4 = 0;
    do {
      local_b0 = (pointer)CONCAT71(local_b0._1_7_,bVar22);
      std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::resize
                (&local_98,
                 ((long)local_98.
                        super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_98.
                        super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
      offset_data = local_98.
                    super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                    _M_impl.super__Vector_impl_data._M_finish + -1;
      exr_header = exr_headers[uVar4];
      if ((exr_header->tiled == 0) || (exr_header->tile_level_mode == 0)) {
        tinyexr::InitSingleResolutionOffsets(offset_data,(long)exr_header->chunk_count);
        plVar1 = *(long **)&(((offset_data->offsets).
                              super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            )._M_impl;
        lVar9 = *plVar1;
        if (plVar1[1] != lVar9) {
          uVar13 = 0;
LAB_001caa77:
          if (*puVar21 < size) goto code_r0x001caa83;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,"Invalid offset size in EXR header chunks.","");
LAB_001cab56:
          _Var2._M_p = local_d0._M_dataplus._M_p;
          if (err != (char **)0x0) {
            pcVar7 = strdup(local_d0._M_dataplus._M_p);
            *err = pcVar7;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var2._M_p != &local_d0.field_2) {
            operator_delete(_Var2._M_p);
          }
          local_e4 = -4;
          iVar19 = local_e4;
          if (((ulong)local_b0 & 1) == 0) break;
          goto LAB_001cad4d;
        }
      }
      else {
        local_80 = local_98.
                   super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_50 = size;
        tinyexr::PrecalculateTileInfo(&local_78,&local_48,exr_header);
        local_9c = tinyexr::InitTileOffsets(offset_data,exr_headers[uVar4],&local_78,&local_48);
        size = local_50;
        local_a0 = exr_headers[uVar4]->chunk_count;
        if (local_9c != local_a0) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,"Invalid offset table size.","");
          _Var2._M_p = local_d0._M_dataplus._M_p;
          if (err != (char **)0x0) {
            pcVar7 = strdup(local_d0._M_dataplus._M_p);
            *err = pcVar7;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var2._M_p != &local_d0.field_2) {
            operator_delete(_Var2._M_p);
          }
          local_e4 = -4;
        }
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        iVar19 = local_e4;
        if (local_9c != local_a0) goto LAB_001cad4d;
        pvVar5 = local_80[-1].offsets.
                 super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar12 = local_80[-1].offsets.
                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pvVar12 != pvVar5) {
          uVar13 = 0;
          do {
            pvVar14 = pvVar5[uVar13].
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (pvVar5[uVar13].
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != pvVar14) {
              uVar8 = 0;
              do {
                puVar17 = pvVar14[uVar8].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (pvVar14[uVar8].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_finish != puVar17) {
                  uVar15 = 1;
                  uVar18 = 0;
                  do {
                    uVar6 = uVar15;
                    if (size <= *puVar21) {
                      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_d0,"Invalid offset size in EXR header chunks.","")
                      ;
                      goto LAB_001cab56;
                    }
                    puVar17[uVar18] = *puVar21 + 4;
                    puVar21 = puVar21 + 1;
                    pvVar5 = (offset_data->offsets).
                             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    pvVar14 = pvVar5[uVar13].
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    puVar17 = pvVar14[uVar8].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    uVar15 = (ulong)((int)uVar6 + 1);
                    uVar18 = uVar6;
                  } while (uVar6 < (ulong)((long)pvVar14[uVar8].
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)puVar17 >> 3));
                }
                uVar8 = (ulong)((int)uVar8 + 1);
                uVar15 = ((long)pvVar5[uVar13].
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar14 >> 3) *
                         -0x5555555555555555;
              } while (uVar8 <= uVar15 && uVar15 - uVar8 != 0);
              pvVar12 = local_80[-1].offsets.
                        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            uVar13 = (ulong)((int)uVar13 + 1);
            uVar8 = ((long)pvVar12 - (long)pvVar5 >> 3) * -0x5555555555555555;
          } while (uVar13 <= uVar8 && uVar8 - uVar13 != 0);
        }
      }
LAB_001caaac:
      uVar4 = uVar4 + 1;
      bVar22 = uVar4 < __n;
    } while (uVar4 != __n);
    uVar4 = 0;
    do {
      pvVar5 = local_98.
               super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl
               .super__Vector_impl_data._M_start[uVar4].offsets.
               super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = (long)local_98.
                    super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar4].offsets.
                    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5;
      if (lVar9 != 0) {
        uVar13 = (lVar9 >> 3) * -0x5555555555555555;
        uVar8 = 0;
        do {
          lVar9 = *(long *)&pvVar5[uVar8].
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl;
          lVar16 = (long)*(pointer *)
                          ((long)&pvVar5[uVar8].
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl + 8) - lVar9;
          local_b0 = pvVar5;
          if (lVar16 != 0) {
            uVar15 = (lVar16 >> 3) * -0x5555555555555555;
            uVar18 = 0;
            do {
              lVar16 = *(long *)(lVar9 + uVar18 * 0x18);
              lVar10 = *(long *)(lVar9 + 8 + uVar18 * 0x18) - lVar16;
              if (lVar10 != 0) {
                uVar6 = 0;
                uVar20 = 1;
                do {
                  if (uVar4 != *(uint *)(local_a8 + *(long *)(lVar16 + uVar6 * 8) + -4)) {
                    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_d0,"Invalid `part number\' in EXR header chunks.",""
                              );
                    _Var2._M_p = local_d0._M_dataplus._M_p;
                    if (err != (char **)0x0) {
                      pcVar7 = strdup(local_d0._M_dataplus._M_p);
                      *err = pcVar7;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var2._M_p != &local_d0.field_2) {
                      operator_delete(_Var2._M_p);
                    }
                    iVar19 = -4;
                    goto LAB_001cad4d;
                  }
                  bVar22 = uVar20 < (ulong)(lVar10 >> 3);
                  uVar6 = uVar20;
                  uVar20 = (ulong)((int)uVar20 + 1);
                } while (bVar22);
              }
              uVar18 = (ulong)((int)uVar18 + 1);
            } while (uVar18 <= uVar15 && uVar15 - uVar18 != 0);
          }
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (uVar8 <= uVar13 && uVar13 - uVar8 != 0);
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
      iVar3 = tinyexr::DecodeChunk
                        (local_58 + uVar4,exr_headers[uVar4],
                         local_98.
                         super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar4,local_a8,size,&local_d0);
      _Var2._M_p = local_d0._M_dataplus._M_p;
      if (((iVar3 != 0) && (local_e4 = iVar3, err != (char **)0x0)) &&
         (local_d0._M_string_length != 0)) {
        pcVar7 = strdup(local_d0._M_dataplus._M_p);
        *err = pcVar7;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &local_d0.field_2) {
        operator_delete(_Var2._M_p);
      }
      iVar19 = local_e4;
      if (iVar3 != 0) break;
      uVar4 = uVar4 + 1;
      iVar19 = 0;
    } while (uVar4 != __n);
LAB_001cad4d:
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::~vector(&local_98);
  }
  return iVar19;
code_r0x001caa83:
  *(ulong *)(lVar9 + uVar13 * 8) = *puVar21 + 4;
  puVar21 = puVar21 + 1;
  uVar13 = uVar13 + 1;
  lVar9 = *plVar1;
  if ((ulong)(plVar1[1] - lVar9 >> 3) <= uVar13) goto LAB_001caaac;
  goto LAB_001caa77;
}

Assistant:

int LoadEXRMultipartImageFromMemory(EXRImage *exr_images,
                                    const EXRHeader **exr_headers,
                                    unsigned int num_parts,
                                    const unsigned char *memory,
                                    const size_t size, const char **err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts == 0 ||
      memory == NULL || (size <= tinyexr::kEXRVersionSize)) {
    tinyexr::SetErrorMessage(
        "Invalid argument for LoadEXRMultipartImageFromMemory()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  // compute total header size.
  size_t total_header_size = 0;
  for (unsigned int i = 0; i < num_parts; i++) {
    if (exr_headers[i]->header_len == 0) {
      tinyexr::SetErrorMessage("EXRHeader variable is not initialized.", err);
      return TINYEXR_ERROR_INVALID_ARGUMENT;
    }

    total_header_size += exr_headers[i]->header_len;
  }

  const char *marker = reinterpret_cast<const char *>(
      memory + total_header_size + 4 +
      4);  // +8 for magic number and version header.

  marker += 1;  // Skip empty header.

  // NOTE 1:
  //   In multipart image, There is 'part number' before chunk data.
  //   4 byte : part number
  //   4+     : chunk
  //
  // NOTE 2:
  //   EXR spec says 'part number' is 'unsigned long' but actually this is
  //   'unsigned int(4 bytes)' in OpenEXR implementation...
  //   http://www.openexr.com/openexrfilelayout.pdf

  // Load chunk offset table.
  std::vector<tinyexr::OffsetData> chunk_offset_table_list;
  chunk_offset_table_list.reserve(num_parts);
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    chunk_offset_table_list.resize(chunk_offset_table_list.size() + 1);
    tinyexr::OffsetData& offset_data = chunk_offset_table_list.back();
    if (!exr_headers[i]->tiled || exr_headers[i]->tile_level_mode == TINYEXR_TILE_ONE_LEVEL) {
      tinyexr::InitSingleResolutionOffsets(offset_data, size_t(exr_headers[i]->chunk_count));
      std::vector<tinyexr::tinyexr_uint64>& offset_table = offset_data.offsets[0][0];

      for (size_t c = 0; c < offset_table.size(); c++) {
        tinyexr::tinyexr_uint64 offset;
        memcpy(&offset, marker, 8);
        tinyexr::swap8(&offset);

        if (offset >= size) {
          tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                                   err);
          return TINYEXR_ERROR_INVALID_DATA;
        }

        offset_table[c] = offset + 4;  // +4 to skip 'part number'
        marker += 8;
      }
    } else {
      {
        std::vector<int> num_x_tiles, num_y_tiles;
        tinyexr::PrecalculateTileInfo(num_x_tiles, num_y_tiles, exr_headers[i]);
        int num_blocks = InitTileOffsets(offset_data, exr_headers[i], num_x_tiles, num_y_tiles);
        if (num_blocks != exr_headers[i]->chunk_count) {
          tinyexr::SetErrorMessage("Invalid offset table size.", err);
          return TINYEXR_ERROR_INVALID_DATA;
        }
      }
      for (unsigned int l = 0; l < offset_data.offsets.size(); ++l) {
        for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy) {
          for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {
            tinyexr::tinyexr_uint64 offset;
            memcpy(&offset, marker, sizeof(tinyexr::tinyexr_uint64));
            tinyexr::swap8(&offset);
            if (offset >= size) {
              tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                err);
              return TINYEXR_ERROR_INVALID_DATA;
            }
            offset_data.offsets[l][dy][dx] = offset + 4; // +4 to skip 'part number'
            marker += sizeof(tinyexr::tinyexr_uint64);  // = 8 
          }
        }
      }
    }
  }

  // Decode image.
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    tinyexr::OffsetData &offset_data = chunk_offset_table_list[i];

    // First check 'part number' is identitical to 'i'
    for (unsigned int l = 0; l < offset_data.offsets.size(); ++l)
      for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy)
        for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {

          const unsigned char *part_number_addr =
              memory + offset_data.offsets[l][dy][dx] - 4;  // -4 to move to 'part number' field.
          unsigned int part_no;
          memcpy(&part_no, part_number_addr, sizeof(unsigned int));  // 4
          tinyexr::swap4(&part_no);

          if (part_no != i) {
            tinyexr::SetErrorMessage("Invalid `part number' in EXR header chunks.",
                                     err);
            return TINYEXR_ERROR_INVALID_DATA;
          }
        }

    std::string e;
    int ret = tinyexr::DecodeChunk(&exr_images[i], exr_headers[i], offset_data,
                                   memory, size, &e);
    if (ret != TINYEXR_SUCCESS) {
      if (!e.empty()) {
        tinyexr::SetErrorMessage(e, err);
      }
      return ret;
    }
  }

  return TINYEXR_SUCCESS;
}